

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

int __thiscall
sqvector<SQClassMember>::copy(sqvector<SQClassMember> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  ulong local_50;
  SQUnsignedInteger i;
  SQClassMember local_38;
  EVP_PKEY_CTX *local_18;
  sqvector<SQClassMember> *v_local;
  sqvector<SQClassMember> *this_local;
  
  local_18 = dst;
  v_local = this;
  if (this->_size != 0) {
    local_38.attrs.super_SQObject._type = 0;
    local_38.attrs.super_SQObject._4_4_ = 0;
    local_38.attrs.super_SQObject._unVal.pTable = (SQTable *)0x0;
    local_38.val.super_SQObject._type = 0;
    local_38.val.super_SQObject._4_4_ = 0;
    local_38.val.super_SQObject._unVal.pTable = (SQTable *)0x0;
    SQClassMember::SQClassMember(&local_38);
    resize(this,0,&local_38);
    SQClassMember::~SQClassMember(&local_38);
  }
  if (this->_allocated < *(ulong *)(local_18 + 8)) {
    _realloc(this,*(SQUnsignedInteger *)(local_18 + 8));
  }
  for (local_50 = 0; local_50 < *(ulong *)(local_18 + 8); local_50 = local_50 + 1) {
    SQClassMember::SQClassMember
              (this->_vals + local_50,(SQClassMember *)(*(long *)local_18 + local_50 * 0x20));
  }
  this->_size = *(SQUnsignedInteger *)(local_18 + 8);
  return (int)this;
}

Assistant:

void copy(const sqvector<T>& v)
    {
        if(_size) {
            resize(0); //destroys all previous stuff
        }
        //resize(v._size);
        if(v._size > _allocated) {
            _realloc(v._size);
        }
        for(SQUnsignedInteger i = 0; i < v._size; i++) {
            new ((void *)&_vals[i]) T(v._vals[i]);
        }
        _size = v._size;
    }